

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall Fad<float>::Fad(Fad<float> *this,int sz,int i,float *x)

{
  uint in_EAX;
  undefined8 uStack_18;
  
  this->val_ = *x;
  uStack_18 = (ulong)in_EAX;
  Vector<float>::Vector(&this->dx_,sz,(float *)((long)&uStack_18 + 4));
  this->defaultVal = 0.0;
  (this->dx_).ptr_to_data[i] = 1.0;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}